

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void * columnName(sqlite3_stmt *pStmt,int N,_func_void_ptr_Mem_ptr *xFunc,int useType)

{
  ushort uVar1;
  long lVar2;
  void *pvVar3;
  
  uVar1 = *(ushort *)(pStmt + 0x48);
  if ((uint)N < (uint)uVar1) {
    lVar2 = *(long *)pStmt;
    if (*(sqlite3_mutex **)(lVar2 + 0x18) != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(*(sqlite3_mutex **)(lVar2 + 0x18));
    }
    pvVar3 = (*xFunc)((Mem *)((ulong)((uint)uVar1 * useType + N) * 0x38 + *(long *)(pStmt + 0x20)));
    if (*(char *)(lVar2 + 0x50) != '\0') {
      *(undefined1 *)(lVar2 + 0x50) = 0;
      pvVar3 = (void *)0x0;
    }
    if (*(sqlite3_mutex **)(lVar2 + 0x18) != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(*(sqlite3_mutex **)(lVar2 + 0x18));
    }
  }
  else {
    pvVar3 = (void *)0x0;
  }
  return pvVar3;
}

Assistant:

static const void *columnName(
  sqlite3_stmt *pStmt,
  int N,
  const void *(*xFunc)(Mem*),
  int useType
){
  const void *ret = 0;
  Vdbe *p = (Vdbe *)pStmt;
  int n;
  sqlite3 *db = p->db;
  
  assert( db!=0 );
  n = sqlite3_column_count(pStmt);
  if( N<n && N>=0 ){
    N += useType*n;
    sqlite3_mutex_enter(db->mutex);
    assert( db->mallocFailed==0 );
    ret = xFunc(&p->aColName[N]);
     /* A malloc may have failed inside of the xFunc() call. If this
    ** is the case, clear the mallocFailed flag and return NULL.
    */
    if( db->mallocFailed ){
      db->mallocFailed = 0;
      ret = 0;
    }
    sqlite3_mutex_leave(db->mutex);
  }
  return ret;
}